

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ODUPCEWriter.cpp
# Opt level: O1

BitMatrix * __thiscall
ZXing::OneD::UPCEWriter::encode
          (BitMatrix *__return_storage_ptr__,UPCEWriter *this,string *contents,int width,int height)

{
  undefined4 in_register_0000000c;
  string_view utf8;
  wstring local_48;
  
  utf8._M_str._4_4_ = in_register_0000000c;
  utf8._M_str._0_4_ = width;
  utf8._M_len = (size_t)(contents->_M_dataplus)._M_p;
  FromUtf8_abi_cxx11_(&local_48,(ZXing *)contents->_M_string_length,utf8);
  encode(__return_storage_ptr__,this,&local_48,width,height);
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)local_48._M_dataplus._M_p != &local_48.field_2) {
    operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity * 4 + 4);
  }
  return __return_storage_ptr__;
}

Assistant:

BitMatrix UPCEWriter::encode(const std::string& contents, int width, int height) const
{
	return encode(FromUtf8(contents), width, height);
}